

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

bool xatlas::internal::param::Solver::LeastSquaresSolver
               (Matrix *A,FullVector *b,FullVector *x,float epsilon)

{
  long *plVar1;
  float fVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  bool bVar6;
  char *__function;
  ulong uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Matrix At;
  Matrix AtA;
  FullVector Atb;
  Matrix local_a0;
  FullVector *local_80;
  ulong local_78;
  long local_70;
  Matrix local_68;
  ArrayBase local_48;
  
  uVar11 = A->m_width;
  if (uVar11 != (x->m_array).m_base.size) {
    __assert_fail("A.width() == x.dimension()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x166d,
                  "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
                 );
  }
  uVar3 = (A->m_array).m_base.size;
  if (uVar3 != (b->m_array).m_base.size) {
    __assert_fail("A.height() == b.dimension()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x166e,
                  "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
                 );
  }
  if (uVar3 < uVar11) {
    __assert_fail("A.height() >= A.width()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x166f,
                  "static bool xatlas::internal::param::Solver::LeastSquaresSolver(const sparse::Matrix &, const FullVector &, FullVector &, float)"
                 );
  }
  sparse::Matrix::Matrix(&local_a0,uVar3,uVar11);
  uVar3 = A->m_width;
  if (uVar3 != local_a0.m_array.m_base.size) {
    __assert_fail("A.width() == B.height()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x128a,"void xatlas::internal::sparse::transpose(const Matrix &, Matrix &)");
  }
  if (local_a0.m_width != (A->m_array).m_base.size) {
    __assert_fail("B.width() == A.height()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x128b,"void xatlas::internal::sparse::transpose(const Matrix &, Matrix &)");
  }
  if (uVar3 != 0) {
    uVar8 = 0;
    do {
      sparse::Matrix::clearRow(&local_a0,uVar8);
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  uVar12 = (ulong)(A->m_array).m_base.size;
  local_80 = x;
  if (uVar12 != 0) {
    uVar9 = 0;
    do {
      if ((A->m_array).m_base.size <= uVar9) goto LAB_001ba658;
      puVar4 = (A->m_array).m_base.buffer;
      uVar7 = (ulong)*(uint *)(puVar4 + uVar9 * 0x18 + 0xc);
      if (uVar7 != 0) {
        plVar1 = (long *)(puVar4 + uVar9 * 0x18);
        uVar10 = 0;
        do {
          if (*(uint *)((long)plVar1 + 0xc) <= uVar10) goto LAB_001ba639;
          lVar5 = *plVar1;
          uVar8 = *(uint32_t *)(lVar5 + uVar10 * 8);
          if (uVar3 <= uVar8) {
            __assert_fail("c.x < w",
                          "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                          ,0x1296,
                          "void xatlas::internal::sparse::transpose(const Matrix &, Matrix &)");
          }
          sparse::Matrix::setCoefficient
                    (&local_a0,(uint32_t)uVar9,uVar8,*(float *)(lVar5 + 4 + uVar10 * 8));
          uVar10 = uVar10 + 1;
        } while (uVar7 != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar12);
  }
  FullVector::FullVector((FullVector *)&local_48,uVar11);
  sparse::mult(&local_a0,b,(FullVector *)&local_48);
  sparse::Matrix::Matrix(&local_68,uVar11);
  if (local_a0.m_width != (A->m_array).m_base.size) {
    __assert_fail("aw == bh",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x12a5,
                  "void xatlas::internal::sparse::sgemm(float, const Matrix &, const Matrix &, float, Matrix &)"
                 );
  }
  if (A->m_width != local_a0.m_array.m_base.size) {
    __assert_fail("bw == ah",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x12a6,
                  "void xatlas::internal::sparse::sgemm(float, const Matrix &, const Matrix &, float, Matrix &)"
                 );
  }
  if (local_68.m_width != A->m_width) {
    __assert_fail("w == bw",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x12a7,
                  "void xatlas::internal::sparse::sgemm(float, const Matrix &, const Matrix &, float, Matrix &)"
                 );
  }
  local_78 = (ulong)local_68.m_array.m_base.size;
  if (local_68.m_array.m_base.size != local_a0.m_array.m_base.size) {
    __assert_fail("h == ah",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x12a8,
                  "void xatlas::internal::sparse::sgemm(float, const Matrix &, const Matrix &, float, Matrix &)"
                 );
  }
  if (local_78 != 0) {
    uVar12 = 0;
    do {
      if (local_68.m_width != 0) {
        uVar8 = 0;
        local_70 = uVar12 * 3;
        do {
          lVar5 = local_70;
          uVar11 = (uint)uVar12;
          fVar13 = sparse::Matrix::getCoefficient(&local_68,uVar8,uVar11);
          if (local_a0.m_array.m_base.size <= uVar11) goto LAB_001ba658;
          uVar3 = *(uint *)(local_a0.m_array.m_base.buffer + lVar5 * 8 + 0xc);
          if ((ulong)uVar3 == 0) {
            fVar15 = 0.0;
          }
          else {
            plVar1 = (long *)(local_a0.m_array.m_base.buffer + lVar5 * 8);
            fVar15 = 0.0;
            uVar9 = 0;
            do {
              if (*(uint *)((long)plVar1 + 0xc) <= uVar9) goto LAB_001ba639;
              lVar5 = *plVar1;
              fVar2 = *(float *)(lVar5 + 4 + uVar9 * 8);
              fVar14 = sparse::Matrix::getCoefficient(A,uVar8,*(uint32_t *)(lVar5 + uVar9 * 8));
              fVar15 = fVar15 + fVar2 * fVar14;
              uVar9 = uVar9 + 1;
            } while (uVar3 != uVar9);
          }
          sparse::Matrix::setCoefficient(&local_68,uVar8,uVar11,fVar13 * 0.0 + fVar15);
          uVar8 = uVar8 + 1;
        } while (uVar8 != local_68.m_width);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_78);
  }
  bVar6 = SymmetricSolver(&local_68,(FullVector *)&local_48,local_80,epsilon);
  sparse::Matrix::~Matrix(&local_68);
  ArrayBase::~ArrayBase(&local_48);
  sparse::Matrix::~Matrix(&local_a0);
  return bVar6;
LAB_001ba658:
  __function = 
  "const T &xatlas::internal::Array<xatlas::internal::Array<xatlas::internal::sparse::Matrix::Coefficient>>::operator[](uint32_t) const [T = xatlas::internal::Array<xatlas::internal::sparse::Matrix::Coefficient>]"
  ;
  goto LAB_001ba64e;
LAB_001ba639:
  __function = 
  "const T &xatlas::internal::Array<xatlas::internal::sparse::Matrix::Coefficient>::operator[](uint32_t) const [T = xatlas::internal::sparse::Matrix::Coefficient]"
  ;
LAB_001ba64e:
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4a8,__function);
}

Assistant:

static bool LeastSquaresSolver(const sparse::Matrix &A, const FullVector &b, FullVector &x, float epsilon = 1e-5f)
	{
		XA_DEBUG_ASSERT(A.width() == x.dimension());
		XA_DEBUG_ASSERT(A.height() == b.dimension());
		XA_DEBUG_ASSERT(A.height() >= A.width()); // @@ If height == width we could solve it directly...
		const uint32_t D = A.width();
		sparse::Matrix At(A.height(), A.width());
		sparse::transpose(A, At);
		FullVector Atb(D);
		sparse::mult(At, b, Atb);
		sparse::Matrix AtA(D);
		sparse::mult(At, A, AtA);
		return SymmetricSolver(AtA, Atb, x, epsilon);
	}